

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyi_generator.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::python::PyiGenerator::GetFieldType_abi_cxx11_
          (string *__return_storage_ptr__,PyiGenerator *this,FieldDescriptor *field_des,
          Descriptor *containing_des)

{
  byte bVar1;
  size_t __n;
  ushort *puVar2;
  string *psVar3;
  int iVar4;
  Descriptor *descriptor;
  ulong uVar5;
  EnumDescriptor *descriptor_00;
  uint uVar6;
  char *pcVar7;
  char *pcVar8;
  AlphaNum *in_R8;
  string_view filename;
  string module;
  string local_f0;
  string local_d0;
  LogMessage local_b0 [3];
  AlphaNum local_80;
  AlphaNum local_50;
  
  bVar1 = field_des->type_;
  uVar6 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)bVar1 * 4) - 1;
  if (9 < uVar6) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_b0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/python/pyi_generator.cc"
               ,0x18a);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (local_b0,(char (*) [24])"Unsupported field type.");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_b0)
    ;
  }
  pcVar7 = (char *)((long)&switchD_00202caf::switchdataD_0055341c +
                   (long)(int)(&switchD_00202caf::switchdataD_0055341c)[uVar6]);
  switch(*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)bVar1 * 4)) {
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "int";
    pcVar7 = "";
    break;
  case 5:
  case 6:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "float";
    pcVar7 = "";
    break;
  case 7:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "bool";
    pcVar7 = "";
    break;
  case 8:
    descriptor_00 = FieldDescriptor::enum_type(field_des);
    ModuleLevelName<google::protobuf::EnumDescriptor>(__return_storage_ptr__,this,descriptor_00);
    return __return_storage_ptr__;
  case 9:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (bVar1 == 9) {
      pcVar8 = "str";
      pcVar7 = "";
    }
    else {
      pcVar8 = "bytes";
      pcVar7 = "";
    }
    break;
  case 10:
    descriptor = FieldDescriptor::message_type(field_des);
    ModuleLevelName<google::protobuf::Descriptor>(__return_storage_ptr__,this,descriptor);
    if (containing_des->containing_type_ == (Descriptor *)0x0) {
      return __return_storage_ptr__;
    }
    __n = __return_storage_ptr__->_M_string_length;
    puVar2 = (ushort *)(containing_des->all_names_).payload_;
    uVar5 = (ulong)*puVar2;
    if (__n != uVar5) {
      return __return_storage_ptr__;
    }
    if ((__n != 0) &&
       (iVar4 = bcmp((__return_storage_ptr__->_M_dataplus)._M_p,(void *)((long)puVar2 + ~uVar5),__n)
       , iVar4 != 0)) {
      return __return_storage_ptr__;
    }
    psVar3 = field_des->file_->name_;
    filename._M_str = pcVar7;
    filename._M_len = (size_t)(psVar3->_M_dataplus)._M_p;
    ModuleName_abi_cxx11_(&local_f0,(python *)psVar3->_M_string_length,filename);
    local_b0[0]._0_8_ = local_f0._M_string_length;
    local_b0[0].data_._M_t.
    super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
    ._M_t.
    super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
    .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
    _M_head_impl = (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                    )(__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                      )local_f0._M_dataplus._M_p;
    local_50.piece_._M_len = 1;
    local_50.piece_._M_str = ".";
    local_80.piece_._M_str = (__return_storage_ptr__->_M_dataplus)._M_p;
    local_80.piece_._M_len = __return_storage_ptr__->_M_string_length;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_d0,(lts_20250127 *)local_b0,&local_50,&local_80,in_R8);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p == &local_f0.field_2) {
      return __return_storage_ptr__;
    }
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar8,pcVar7);
  return __return_storage_ptr__;
}

Assistant:

std::string PyiGenerator::GetFieldType(
    const FieldDescriptor& field_des, const Descriptor& containing_des) const {
  switch (field_des.cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
    case FieldDescriptor::CPPTYPE_UINT32:
    case FieldDescriptor::CPPTYPE_INT64:
    case FieldDescriptor::CPPTYPE_UINT64:
      return "int";
    case FieldDescriptor::CPPTYPE_DOUBLE:
    case FieldDescriptor::CPPTYPE_FLOAT:
      return "float";
    case FieldDescriptor::CPPTYPE_BOOL:
      return "bool";
    case FieldDescriptor::CPPTYPE_ENUM:
      return ModuleLevelName(*field_des.enum_type());
    case FieldDescriptor::CPPTYPE_STRING:
      if (field_des.type() == FieldDescriptor::TYPE_STRING) {
        return "str";
      } else {
        return "bytes";
      }
    case FieldDescriptor::CPPTYPE_MESSAGE: {
      // If the field is inside a nested message and the nested message has the
      // same name as a top-level message, then we need to prefix the field type
      // with the module name for disambiguation.
      std::string name = ModuleLevelName(*field_des.message_type());
      if ((containing_des.containing_type() != nullptr &&
           name == containing_des.name())) {
        std::string module = ModuleName(field_des.file()->name());
        name = absl::StrCat(module, ".", name);
      }
      return name;
    }
    default:
      ABSL_LOG(FATAL) << "Unsupported field type.";
  }
  return "";
}